

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::is_non_native_row_major_matrix(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  SPIRExpression *pSVar2;
  
  if (((this->backend).native_row_major_matrix == true) && (bVar1 = is_legacy(this), !bVar1)) {
    return false;
  }
  pSVar2 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,id);
  if (pSVar2 != (SPIRExpression *)0x0) {
    return pSVar2->need_transpose;
  }
  bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)id,DecorationRowMajor);
  return bVar1;
}

Assistant:

bool CompilerGLSL::is_non_native_row_major_matrix(uint32_t id)
{
	// Natively supported row-major matrices do not need to be converted.
	// Legacy targets do not support row major.
	if (backend.native_row_major_matrix && !is_legacy())
		return false;

	auto *e = maybe_get<SPIRExpression>(id);
	if (e)
		return e->need_transpose;
	else
		return has_decoration(id, DecorationRowMajor);
}